

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::TriangleMIntersectorKMoeller<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  int iVar5;
  undefined4 uVar6;
  size_t sVar7;
  undefined8 uVar8;
  Scene *pSVar9;
  RTCFilterFunctionN p_Var10;
  undefined1 auVar11 [16];
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  StackItemT<embree::NodeRefPtr<4>_> *pSVar18;
  int iVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  Geometry *pGVar22;
  long lVar23;
  ulong uVar24;
  size_t sVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  Geometry *pGVar30;
  ulong uVar31;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar32;
  ulong uVar33;
  long lVar34;
  ulong unaff_R13;
  size_t mask;
  ulong uVar35;
  long lVar36;
  float fVar37;
  uint uVar38;
  float fVar48;
  float fVar50;
  vint4 bi;
  uint uVar49;
  uint uVar51;
  float fVar52;
  uint uVar53;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar47;
  int iVar59;
  int iVar60;
  vint4 bi_1;
  int iVar61;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  float fVar62;
  uint uVar63;
  float fVar69;
  float fVar71;
  vint4 ai;
  uint uVar70;
  uint uVar72;
  float fVar74;
  uint uVar75;
  StackItemT<embree::NodeRefPtr<4>_> SVar64;
  float fVar73;
  float fVar76;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  float fVar80;
  vint4 ai_1;
  StackItemT<embree::NodeRefPtr<4>_> SVar77;
  float fVar81;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  float fVar82;
  float fVar87;
  float fVar88;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  float fVar89;
  undefined1 auVar86 [16];
  float fVar90;
  float fVar94;
  float fVar95;
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar93;
  float fVar96;
  float fVar99;
  float fVar100;
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  float fVar101;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  float fVar114;
  float fVar115;
  float fVar116;
  float fVar117;
  float fVar118;
  float fVar119;
  float fVar120;
  float fVar121;
  float fVar122;
  float fVar123;
  float fVar124;
  float fVar125;
  float fVar126;
  float fVar127;
  float fVar128;
  float fVar129;
  int iVar130;
  float fVar131;
  int iVar132;
  float fVar133;
  int iVar134;
  float fVar135;
  int iVar136;
  float fVar137;
  float fVar138;
  float fVar139;
  float fVar140;
  float fVar141;
  StackItemT<embree::NodeRefPtr<4>_> *pSStack_1230;
  undefined8 local_1208;
  vbool<4> valid;
  undefined8 local_11b8;
  undefined8 uStack_11b0;
  long local_11a8;
  ulong local_11a0;
  ulong local_1198;
  ulong local_1190;
  StackItemT<embree::NodeRefPtr<4>_> *local_1188;
  undefined8 *local_1180;
  RTCFilterFunctionNArguments args;
  vfloat<4> tNear;
  float local_10e8 [4];
  float local_10d8 [4];
  undefined1 local_10c8 [16];
  undefined8 local_10b8;
  undefined8 uStack_10b0;
  undefined1 local_10a8 [16];
  float local_1098 [4];
  undefined1 local_1088 [16];
  int local_1078;
  int iStack_1074;
  int iStack_1070;
  int iStack_106c;
  float local_1068;
  float fStack_1064;
  float fStack_1060;
  float fStack_105c;
  float local_1058;
  float fStack_1054;
  float fStack_1050;
  float fStack_104c;
  float local_1048;
  float fStack_1044;
  float fStack_1040;
  float fStack_103c;
  float local_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  float local_1028;
  float fStack_1024;
  float fStack_1020;
  float fStack_101c;
  float local_1018;
  float fStack_1014;
  float fStack_1010;
  float fStack_100c;
  HitK<4> h;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 auVar102 [16];
  
  pSVar32 = stack + 1;
  stack[0].ptr.ptr = root.ptr;
  stack[0].dist = 0;
  local_1018 = *(float *)((long)&(tray->org).field_0 + k * 4);
  local_1028 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  local_1038 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_1048 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  local_1058 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  local_1068 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  uVar26 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar27 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar28 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar31 = uVar26 ^ 0x10;
  uVar35 = uVar27 ^ 0x10;
  uVar33 = uVar28 ^ 0x10;
  local_1078 = (tray->tnear).field_0.i[k];
  iVar19 = (tray->tfar).field_0.i[k];
  local_1180 = (undefined8 *)(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  fStack_1014 = local_1018;
  fStack_1010 = local_1018;
  fStack_100c = local_1018;
  fStack_1024 = local_1028;
  fStack_1020 = local_1028;
  fStack_101c = local_1028;
  fStack_1034 = local_1038;
  fStack_1030 = local_1038;
  fStack_102c = local_1038;
  fStack_1044 = local_1048;
  fStack_1040 = local_1048;
  fStack_103c = local_1048;
  fStack_1054 = local_1058;
  fStack_1050 = local_1058;
  fStack_104c = local_1058;
  fStack_1064 = local_1068;
  fStack_1060 = local_1068;
  fStack_105c = local_1068;
  iStack_1074 = local_1078;
  iStack_1070 = local_1078;
  iStack_106c = local_1078;
  fVar89 = local_1018;
  fVar107 = local_1018;
  fVar101 = local_1018;
  fVar103 = local_1018;
  fVar96 = local_1028;
  fVar113 = local_1028;
  fVar116 = local_1028;
  fVar119 = local_1028;
  fVar122 = local_1038;
  fVar125 = local_1038;
  fVar99 = local_1038;
  fVar100 = local_1038;
  fVar73 = local_1048;
  fVar76 = local_1048;
  fVar110 = local_1048;
  fVar112 = local_1048;
  fVar114 = local_1058;
  fVar117 = local_1058;
  fVar120 = local_1058;
  fVar123 = local_1058;
  fVar126 = local_1068;
  fVar127 = local_1068;
  fVar128 = local_1068;
  fVar129 = local_1068;
  iVar130 = local_1078;
  iVar132 = local_1078;
  iVar134 = local_1078;
  iVar136 = local_1078;
  iVar59 = iVar19;
  iVar60 = iVar19;
  iVar61 = iVar19;
  do {
    do {
      do {
        pSStack_1230 = stack;
        if (pSVar32 == pSStack_1230) {
          return;
        }
        pSVar18 = pSVar32 + -1;
        pSVar32 = pSVar32 + -1;
      } while (*(float *)(ray + k * 4 + 0x80) <= (float)pSVar18->dist &&
               (float)pSVar18->dist != *(float *)(ray + k * 4 + 0x80));
      sVar25 = (pSVar32->ptr).ptr;
      do {
        if ((sVar25 & 8) == 0) {
          pfVar1 = (float *)(sVar25 + 0x20 + uVar26);
          fVar37 = (*pfVar1 - fVar89) * fVar73;
          fVar48 = (pfVar1[1] - fVar107) * fVar76;
          fVar50 = (pfVar1[2] - fVar101) * fVar110;
          fVar52 = (pfVar1[3] - fVar103) * fVar112;
          pfVar1 = (float *)(sVar25 + 0x20 + uVar27);
          fVar62 = (*pfVar1 - fVar96) * fVar114;
          fVar69 = (pfVar1[1] - fVar113) * fVar117;
          fVar71 = (pfVar1[2] - fVar116) * fVar120;
          fVar74 = (pfVar1[3] - fVar119) * fVar123;
          uVar63 = (uint)((int)fVar62 < (int)fVar37) * (int)fVar37 |
                   (uint)((int)fVar62 >= (int)fVar37) * (int)fVar62;
          uVar70 = (uint)((int)fVar69 < (int)fVar48) * (int)fVar48 |
                   (uint)((int)fVar69 >= (int)fVar48) * (int)fVar69;
          uVar72 = (uint)((int)fVar71 < (int)fVar50) * (int)fVar50 |
                   (uint)((int)fVar71 >= (int)fVar50) * (int)fVar71;
          uVar75 = (uint)((int)fVar74 < (int)fVar52) * (int)fVar52 |
                   (uint)((int)fVar74 >= (int)fVar52) * (int)fVar74;
          pfVar1 = (float *)(sVar25 + 0x20 + uVar28);
          fVar37 = (*pfVar1 - fVar122) * fVar126;
          fVar48 = (pfVar1[1] - fVar125) * fVar127;
          fVar50 = (pfVar1[2] - fVar99) * fVar128;
          fVar52 = (pfVar1[3] - fVar100) * fVar129;
          uVar38 = (uint)((int)fVar37 < iVar130) * iVar130 |
                   (uint)((int)fVar37 >= iVar130) * (int)fVar37;
          uVar49 = (uint)((int)fVar48 < iVar132) * iVar132 |
                   (uint)((int)fVar48 >= iVar132) * (int)fVar48;
          uVar51 = (uint)((int)fVar50 < iVar134) * iVar134 |
                   (uint)((int)fVar50 >= iVar134) * (int)fVar50;
          uVar53 = (uint)((int)fVar52 < iVar136) * iVar136 |
                   (uint)((int)fVar52 >= iVar136) * (int)fVar52;
          tNear.field_0.i[0] =
               ((int)uVar38 < (int)uVar63) * uVar63 | ((int)uVar38 >= (int)uVar63) * uVar38;
          tNear.field_0.i[1] =
               ((int)uVar49 < (int)uVar70) * uVar70 | ((int)uVar49 >= (int)uVar70) * uVar49;
          tNear.field_0.i[2] =
               ((int)uVar51 < (int)uVar72) * uVar72 | ((int)uVar51 >= (int)uVar72) * uVar51;
          tNear.field_0.i[3] =
               ((int)uVar53 < (int)uVar75) * uVar75 | ((int)uVar53 >= (int)uVar75) * uVar53;
          pfVar1 = (float *)(sVar25 + 0x20 + uVar31);
          fVar37 = (*pfVar1 - fVar89) * fVar73;
          fVar48 = (pfVar1[1] - fVar107) * fVar76;
          fVar50 = (pfVar1[2] - fVar101) * fVar110;
          fVar52 = (pfVar1[3] - fVar103) * fVar112;
          pfVar1 = (float *)(sVar25 + 0x20 + uVar35);
          fVar62 = (*pfVar1 - fVar96) * fVar114;
          fVar69 = (pfVar1[1] - fVar113) * fVar117;
          fVar71 = (pfVar1[2] - fVar116) * fVar120;
          fVar74 = (pfVar1[3] - fVar119) * fVar123;
          uVar63 = (uint)((int)fVar37 < (int)fVar62) * (int)fVar37 |
                   (uint)((int)fVar37 >= (int)fVar62) * (int)fVar62;
          uVar70 = (uint)((int)fVar48 < (int)fVar69) * (int)fVar48 |
                   (uint)((int)fVar48 >= (int)fVar69) * (int)fVar69;
          uVar72 = (uint)((int)fVar50 < (int)fVar71) * (int)fVar50 |
                   (uint)((int)fVar50 >= (int)fVar71) * (int)fVar71;
          uVar75 = (uint)((int)fVar52 < (int)fVar74) * (int)fVar52 |
                   (uint)((int)fVar52 >= (int)fVar74) * (int)fVar74;
          pfVar1 = (float *)(sVar25 + 0x20 + uVar33);
          fVar37 = (*pfVar1 - fVar122) * fVar126;
          fVar48 = (pfVar1[1] - fVar125) * fVar127;
          fVar50 = (pfVar1[2] - fVar99) * fVar128;
          fVar52 = (pfVar1[3] - fVar100) * fVar129;
          uVar38 = (uint)(iVar19 < (int)fVar37) * iVar19 |
                   (uint)(iVar19 >= (int)fVar37) * (int)fVar37;
          uVar49 = (uint)(iVar59 < (int)fVar48) * iVar59 |
                   (uint)(iVar59 >= (int)fVar48) * (int)fVar48;
          uVar51 = (uint)(iVar60 < (int)fVar50) * iVar60 |
                   (uint)(iVar60 >= (int)fVar50) * (int)fVar50;
          uVar53 = (uint)(iVar61 < (int)fVar52) * iVar61 |
                   (uint)(iVar61 >= (int)fVar52) * (int)fVar52;
          auVar54._0_4_ =
               -(uint)((int)(((int)uVar63 < (int)uVar38) * uVar63 |
                            ((int)uVar63 >= (int)uVar38) * uVar38) < tNear.field_0.i[0]);
          auVar54._4_4_ =
               -(uint)((int)(((int)uVar70 < (int)uVar49) * uVar70 |
                            ((int)uVar70 >= (int)uVar49) * uVar49) < tNear.field_0.i[1]);
          auVar54._8_4_ =
               -(uint)((int)(((int)uVar72 < (int)uVar51) * uVar72 |
                            ((int)uVar72 >= (int)uVar51) * uVar51) < tNear.field_0.i[2]);
          auVar54._12_4_ =
               -(uint)((int)(((int)uVar75 < (int)uVar53) * uVar75 |
                            ((int)uVar75 >= (int)uVar53) * uVar53) < tNear.field_0.i[3]);
          uVar38 = movmskps((int)pSStack_1230,auVar54);
          unaff_R13 = ((ulong)uVar38 ^ 0xf) & 0xff;
        }
        if ((sVar25 & 8) == 0) {
          if (unaff_R13 == 0) {
            pSStack_1230 = (StackItemT<embree::NodeRefPtr<4>_> *)0x4;
          }
          else {
            uVar24 = sVar25 & 0xfffffffffffffff0;
            lVar23 = 0;
            if (unaff_R13 != 0) {
              for (; (unaff_R13 >> lVar23 & 1) == 0; lVar23 = lVar23 + 1) {
              }
            }
            pSStack_1230 = (StackItemT<embree::NodeRefPtr<4>_> *)0x0;
            sVar25 = *(size_t *)(uVar24 + lVar23 * 8);
            uVar29 = unaff_R13 - 1 & unaff_R13;
            if (uVar29 != 0) {
              uVar38 = tNear.field_0.i[lVar23];
              lVar23 = 0;
              if (uVar29 != 0) {
                for (; (uVar29 >> lVar23 & 1) == 0; lVar23 = lVar23 + 1) {
                }
              }
              sVar7 = *(size_t *)(uVar24 + lVar23 * 8);
              uVar49 = tNear.field_0.i[lVar23];
              uVar29 = uVar29 - 1 & uVar29;
              if (uVar29 == 0) {
                if (uVar38 < uVar49) {
                  (pSVar32->ptr).ptr = sVar7;
                  pSVar32->dist = uVar49;
                  pSVar32 = pSVar32 + 1;
                }
                else {
                  (pSVar32->ptr).ptr = sVar25;
                  pSVar32->dist = uVar38;
                  sVar25 = sVar7;
                  pSVar32 = pSVar32 + 1;
                }
              }
              else {
                auVar65._8_4_ = uVar38;
                auVar65._0_8_ = sVar25;
                auVar65._12_4_ = 0;
                auVar92._8_4_ = uVar49;
                auVar92._0_8_ = sVar7;
                auVar92._12_4_ = 0;
                lVar23 = 0;
                if (uVar29 != 0) {
                  for (; (uVar29 >> lVar23 & 1) == 0; lVar23 = lVar23 + 1) {
                  }
                }
                uVar8 = *(undefined8 *)(uVar24 + lVar23 * 8);
                iVar5 = tNear.field_0.i[lVar23];
                auVar98._8_4_ = iVar5;
                auVar98._0_8_ = uVar8;
                auVar98._12_4_ = 0;
                auVar85._8_4_ = -(uint)((int)uVar38 < (int)uVar49);
                uVar29 = uVar29 - 1 & uVar29;
                if (uVar29 == 0) {
                  auVar85._4_4_ = auVar85._8_4_;
                  auVar85._0_4_ = auVar85._8_4_;
                  auVar85._12_4_ = auVar85._8_4_;
                  auVar83._8_4_ = uVar49;
                  auVar83._0_8_ = sVar7;
                  auVar83._12_4_ = 0;
                  auVar84 = blendvps(auVar83,auVar65,auVar85);
                  auVar54 = blendvps(auVar65,auVar92,auVar85);
                  auVar39._8_4_ = -(uint)(auVar84._8_4_ < iVar5);
                  auVar39._4_4_ = auVar39._8_4_;
                  auVar39._0_4_ = auVar39._8_4_;
                  auVar39._12_4_ = auVar39._8_4_;
                  auVar91._8_4_ = iVar5;
                  auVar91._0_8_ = uVar8;
                  auVar91._12_4_ = 0;
                  auVar92 = blendvps(auVar91,auVar84,auVar39);
                  auVar65 = blendvps(auVar84,auVar98,auVar39);
                  auVar40._8_4_ = -(uint)(auVar54._8_4_ < auVar65._8_4_);
                  auVar40._4_4_ = auVar40._8_4_;
                  auVar40._0_4_ = auVar40._8_4_;
                  auVar40._12_4_ = auVar40._8_4_;
                  SVar77 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar65,auVar54,auVar40);
                  SVar64 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar54,auVar65,auVar40);
                  *pSVar32 = SVar64;
                  pSVar32[1] = SVar77;
                  sVar25 = auVar92._0_8_;
                  pSVar32 = pSVar32 + 2;
                }
                else {
                  lVar23 = 0;
                  if (uVar29 != 0) {
                    for (; (uVar29 >> lVar23 & 1) == 0; lVar23 = lVar23 + 1) {
                    }
                  }
                  auVar84._4_4_ = auVar85._8_4_;
                  auVar84._0_4_ = auVar85._8_4_;
                  auVar84._8_4_ = auVar85._8_4_;
                  auVar84._12_4_ = auVar85._8_4_;
                  auVar85 = blendvps(auVar92,auVar65,auVar84);
                  auVar54 = blendvps(auVar65,auVar92,auVar84);
                  auVar97._8_4_ = tNear.field_0.i[lVar23];
                  auVar97._0_8_ = *(undefined8 *)(uVar24 + lVar23 * 8);
                  auVar97._12_4_ = 0;
                  auVar41._8_4_ = -(uint)(iVar5 < tNear.field_0.i[lVar23]);
                  auVar41._4_4_ = auVar41._8_4_;
                  auVar41._0_4_ = auVar41._8_4_;
                  auVar41._12_4_ = auVar41._8_4_;
                  auVar92 = blendvps(auVar97,auVar98,auVar41);
                  auVar65 = blendvps(auVar98,auVar97,auVar41);
                  auVar42._8_4_ = -(uint)(auVar54._8_4_ < auVar65._8_4_);
                  auVar42._4_4_ = auVar42._8_4_;
                  auVar42._0_4_ = auVar42._8_4_;
                  auVar42._12_4_ = auVar42._8_4_;
                  auVar98 = blendvps(auVar65,auVar54,auVar42);
                  SVar64 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar54,auVar65,auVar42);
                  auVar43._8_4_ = -(uint)(auVar85._8_4_ < auVar92._8_4_);
                  auVar43._4_4_ = auVar43._8_4_;
                  auVar43._0_4_ = auVar43._8_4_;
                  auVar43._12_4_ = auVar43._8_4_;
                  auVar54 = blendvps(auVar92,auVar85,auVar43);
                  auVar65 = blendvps(auVar85,auVar92,auVar43);
                  auVar44._8_4_ = -(uint)(auVar65._8_4_ < auVar98._8_4_);
                  auVar44._4_4_ = auVar44._8_4_;
                  auVar44._0_4_ = auVar44._8_4_;
                  auVar44._12_4_ = auVar44._8_4_;
                  SVar93 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar98,auVar65,auVar44);
                  SVar77 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar65,auVar98,auVar44);
                  *pSVar32 = SVar64;
                  pSVar32[1] = SVar77;
                  pSVar32[2] = SVar93;
                  sVar25 = auVar54._0_8_;
                  pSVar32 = pSVar32 + 3;
                }
              }
            }
          }
        }
        else {
          pSStack_1230 = (StackItemT<embree::NodeRefPtr<4>_> *)0x6;
        }
      } while ((int)pSStack_1230 == 0);
    } while ((int)pSStack_1230 != 6);
    lVar23 = (ulong)((uint)sVar25 & 0xf) - 8;
    if (lVar23 != 0) {
      uVar24 = sVar25 & 0xfffffffffffffff0;
      lVar36 = 0;
      do {
        lVar34 = lVar36 * 0xb0;
        pfVar1 = (float *)(uVar24 + 0x80 + lVar34);
        fVar116 = *pfVar1;
        fVar119 = pfVar1[1];
        fVar122 = pfVar1[2];
        fVar125 = pfVar1[3];
        pfVar1 = (float *)(uVar24 + 0x40 + lVar34);
        fVar99 = *pfVar1;
        fVar100 = pfVar1[1];
        fVar73 = pfVar1[2];
        fVar76 = pfVar1[3];
        pfVar1 = (float *)(uVar24 + 0x70 + lVar34);
        fVar110 = *pfVar1;
        fVar112 = pfVar1[1];
        fVar114 = pfVar1[2];
        fVar117 = pfVar1[3];
        pfVar1 = (float *)(uVar24 + 0x50 + lVar34);
        fVar120 = *pfVar1;
        fVar123 = pfVar1[1];
        fVar126 = pfVar1[2];
        fVar127 = pfVar1[3];
        fVar71 = fVar110 * fVar120 - fVar116 * fVar99;
        fVar74 = fVar112 * fVar123 - fVar119 * fVar100;
        fVar80 = fVar114 * fVar126 - fVar122 * fVar73;
        fVar81 = fVar117 * fVar127 - fVar125 * fVar76;
        pfVar1 = (float *)(uVar24 + 0x60 + lVar34);
        fVar128 = *pfVar1;
        fVar129 = pfVar1[1];
        fVar37 = pfVar1[2];
        fVar48 = pfVar1[3];
        pfVar4 = (float *)(uVar24 + lVar34);
        pfVar1 = (float *)(uVar24 + 0x10 + lVar34);
        pfVar2 = (float *)(uVar24 + 0x20 + lVar34);
        pfVar3 = (float *)(uVar24 + 0x30 + lVar34);
        fVar50 = *pfVar3;
        fVar52 = pfVar3[1];
        fVar62 = pfVar3[2];
        fVar69 = pfVar3[3];
        local_10a8._0_4_ = fVar116 * fVar50 - fVar120 * fVar128;
        local_10a8._4_4_ = fVar119 * fVar52 - fVar123 * fVar129;
        local_10a8._8_4_ = fVar122 * fVar62 - fVar126 * fVar37;
        local_10a8._12_4_ = fVar125 * fVar69 - fVar127 * fVar48;
        fVar89 = *(float *)(ray + k * 4);
        fVar107 = *(float *)(ray + k * 4 + 0x20);
        fVar101 = *(float *)(ray + k * 4 + 0x40);
        fVar82 = *pfVar4 - fVar89;
        fVar87 = pfVar4[1] - fVar89;
        fVar88 = pfVar4[2] - fVar89;
        fVar89 = pfVar4[3] - fVar89;
        fVar104 = *pfVar2 - fVar107;
        fVar105 = pfVar2[1] - fVar107;
        fVar106 = pfVar2[2] - fVar107;
        fVar107 = pfVar2[3] - fVar107;
        fVar103 = *(float *)(ray + k * 4 + 0x60);
        fVar131 = fVar101 * fVar104 - fVar82 * fVar103;
        fVar133 = fVar101 * fVar105 - fVar87 * fVar103;
        fVar135 = fVar101 * fVar106 - fVar88 * fVar103;
        fVar137 = fVar101 * fVar107 - fVar89 * fVar103;
        local_1098[0] = fVar99 * fVar128 - fVar110 * fVar50;
        local_1098[1] = fVar100 * fVar129 - fVar112 * fVar52;
        local_1098[2] = fVar73 * fVar37 - fVar114 * fVar62;
        local_1098[3] = fVar76 * fVar48 - fVar117 * fVar69;
        fVar96 = *(float *)(ray + k * 4 + 0x10);
        fVar90 = *pfVar1 - fVar96;
        fVar94 = pfVar1[1] - fVar96;
        fVar95 = pfVar1[2] - fVar96;
        fVar96 = pfVar1[3] - fVar96;
        fVar113 = *(float *)(ray + k * 4 + 0x50);
        fVar115 = fVar103 * fVar90 - fVar113 * fVar104;
        fVar118 = fVar103 * fVar94 - fVar113 * fVar105;
        fVar121 = fVar103 * fVar95 - fVar113 * fVar106;
        fVar124 = fVar103 * fVar96 - fVar113 * fVar107;
        local_1208 = CONCAT44(fVar74,fVar71);
        fVar138 = fVar113 * fVar82 - fVar101 * fVar90;
        fVar139 = fVar113 * fVar87 - fVar101 * fVar94;
        fVar140 = fVar113 * fVar88 - fVar101 * fVar95;
        fVar141 = fVar113 * fVar89 - fVar101 * fVar96;
        fVar108 = fVar103 * local_1098[0] + local_10a8._0_4_ * fVar113 + fVar71 * fVar101;
        fVar109 = fVar103 * local_1098[1] + local_10a8._4_4_ * fVar113 + fVar74 * fVar101;
        fVar111 = fVar103 * local_1098[2] + local_10a8._8_4_ * fVar113 + fVar80 * fVar101;
        fVar113 = fVar103 * local_1098[3] + local_10a8._12_4_ * fVar113 + fVar81 * fVar101;
        uVar49 = (uint)fVar108 & 0x80000000;
        uVar51 = (uint)fVar109 & 0x80000000;
        uVar53 = (uint)fVar111 & 0x80000000;
        uVar63 = (uint)fVar113 & 0x80000000;
        tNear.field_0.i[0] =
             (uint)(fVar128 * fVar115 + fVar110 * fVar131 + fVar116 * fVar138) ^ uVar49;
        tNear.field_0.i[1] =
             (uint)(fVar129 * fVar118 + fVar112 * fVar133 + fVar119 * fVar139) ^ uVar51;
        tNear.field_0.i[2] =
             (uint)(fVar37 * fVar121 + fVar114 * fVar135 + fVar122 * fVar140) ^ uVar53;
        tNear.field_0.i[3] =
             (uint)(fVar48 * fVar124 + fVar117 * fVar137 + fVar125 * fVar141) ^ uVar63;
        fVar116 = (float)((uint)(fVar115 * fVar50 + fVar131 * fVar99 + fVar138 * fVar120) ^ uVar49);
        fVar119 = (float)((uint)(fVar118 * fVar52 + fVar133 * fVar100 + fVar139 * fVar123) ^ uVar51)
        ;
        fVar122 = (float)((uint)(fVar121 * fVar62 + fVar135 * fVar73 + fVar140 * fVar126) ^ uVar53);
        fVar125 = (float)((uint)(fVar124 * fVar69 + fVar137 * fVar76 + fVar141 * fVar127) ^ uVar63);
        fVar101 = ABS(fVar108);
        fVar103 = ABS(fVar109);
        auVar102._0_8_ = CONCAT44(fVar109,fVar108) & 0x7fffffff7fffffff;
        auVar102._8_4_ = ABS(fVar111);
        auVar102._12_4_ = ABS(fVar113);
        bVar14 = tNear.field_0.v[0] + fVar116 <= fVar101 &&
                 ((0.0 <= fVar116 && 0.0 <= tNear.field_0.v[0]) && fVar108 != 0.0);
        bVar15 = tNear.field_0.v[1] + fVar119 <= fVar103 &&
                 ((0.0 <= fVar119 && 0.0 <= tNear.field_0.v[1]) && fVar109 != 0.0);
        bVar13 = tNear.field_0.v[2] + fVar122 <= auVar102._8_4_ &&
                 ((0.0 <= fVar122 && 0.0 <= tNear.field_0.v[2]) && fVar111 != 0.0);
        bVar12 = tNear.field_0.v[3] + fVar125 <= auVar102._12_4_ &&
                 ((0.0 <= fVar125 && 0.0 <= tNear.field_0.v[3]) && fVar113 != 0.0);
        auVar11._4_4_ = -(uint)bVar15;
        auVar11._0_4_ = -(uint)bVar14;
        auVar11._8_4_ = -(uint)bVar13;
        auVar11._12_4_ = -(uint)bVar12;
        uVar38 = movmskps((int)pSStack_1230,auVar11);
        pSStack_1230 = (StackItemT<embree::NodeRefPtr<4>_> *)(ulong)uVar38;
        if (uVar38 != 0) {
          fVar113 = (float)(uVar49 ^ (uint)(fVar82 * fVar71 +
                                           fVar90 * local_10a8._0_4_ + fVar104 * local_1098[0]));
          fVar99 = (float)(uVar51 ^ (uint)(fVar87 * fVar74 +
                                          fVar94 * local_10a8._4_4_ + fVar105 * local_1098[1]));
          fVar100 = (float)(uVar53 ^ (uint)(fVar88 * fVar80 +
                                           fVar95 * local_10a8._8_4_ + fVar106 * local_1098[2]));
          fVar96 = (float)(uVar63 ^ (uint)(fVar89 * fVar81 +
                                          fVar96 * local_10a8._12_4_ + fVar107 * local_1098[3]));
          fVar89 = *(float *)(ray + k * 4 + 0x30);
          fVar107 = *(float *)(ray + k * 4 + 0x80);
          valid.field_0.i[0] =
               -(uint)((fVar113 <= fVar107 * fVar101 && fVar89 * fVar101 < fVar113) && bVar14);
          valid.field_0.i[1] =
               -(uint)((fVar99 <= fVar107 * fVar103 && fVar89 * fVar103 < fVar99) && bVar15);
          valid.field_0.i[2] =
               -(uint)((fVar100 <= fVar107 * auVar102._8_4_ && fVar89 * auVar102._8_4_ < fVar100) &&
                      bVar13);
          valid.field_0.i[3] =
               -(uint)((fVar96 <= fVar107 * auVar102._12_4_ && fVar89 * auVar102._12_4_ < fVar96) &&
                      bVar12);
          uVar38 = movmskps(uVar38,(undefined1  [16])valid.field_0);
          pSStack_1230 = (StackItemT<embree::NodeRefPtr<4>_> *)(ulong)uVar38;
          if (uVar38 != 0) {
            local_10b8 = local_1208;
            uStack_10b0 = CONCAT44(fVar81,fVar80);
            pSVar9 = context->scene;
            auVar54 = rcpps(local_10a8,auVar102);
            fVar89 = auVar54._0_4_;
            fVar107 = auVar54._4_4_;
            fVar73 = auVar54._8_4_;
            fVar76 = auVar54._12_4_;
            fVar89 = (1.0 - fVar101 * fVar89) * fVar89 + fVar89;
            fVar107 = (1.0 - fVar103 * fVar107) * fVar107 + fVar107;
            fVar73 = (1.0 - auVar102._8_4_ * fVar73) * fVar73 + fVar73;
            fVar76 = (1.0 - auVar102._12_4_ * fVar76) * fVar76 + fVar76;
            auVar86._0_4_ = fVar113 * fVar89;
            auVar86._4_4_ = fVar99 * fVar107;
            auVar86._8_4_ = fVar100 * fVar73;
            auVar86._12_4_ = fVar96 * fVar76;
            local_10c8 = auVar86;
            local_10e8[0] = tNear.field_0.v[0] * fVar89;
            local_10e8[1] = tNear.field_0.v[1] * fVar107;
            local_10e8[2] = tNear.field_0.v[2] * fVar73;
            local_10e8[3] = tNear.field_0.v[3] * fVar76;
            local_10d8[0] = fVar89 * fVar116;
            local_10d8[1] = fVar107 * fVar119;
            local_10d8[2] = fVar73 * fVar122;
            local_10d8[3] = fVar76 * fVar125;
            auVar65 = blendvps(_DAT_01feb9f0,auVar86,(undefined1  [16])valid.field_0);
            auVar78._4_4_ = auVar65._0_4_;
            auVar78._0_4_ = auVar65._4_4_;
            auVar78._8_4_ = auVar65._12_4_;
            auVar78._12_4_ = auVar65._8_4_;
            auVar54 = minps(auVar78,auVar65);
            auVar55._0_8_ = auVar54._8_8_;
            auVar55._8_4_ = auVar54._0_4_;
            auVar55._12_4_ = auVar54._4_4_;
            auVar54 = minps(auVar55,auVar54);
            uVar38 = -(uint)(auVar54._0_4_ == auVar65._0_4_);
            uVar49 = -(uint)(auVar54._4_4_ == auVar65._4_4_);
            uVar51 = -(uint)(auVar54._8_4_ == auVar65._8_4_);
            uVar53 = -(uint)(auVar54._12_4_ == auVar65._12_4_);
            auVar68._4_4_ = uVar49;
            auVar68._0_4_ = uVar38;
            auVar66._0_4_ = uVar38 & valid.field_0.i[0];
            auVar66._4_4_ = uVar49 & valid.field_0.i[1];
            auVar66._8_4_ = uVar51 & valid.field_0.i[2];
            auVar66._12_4_ = uVar53 & valid.field_0.i[3];
            iVar19 = movmskps((int)context,auVar66);
            auVar67._8_4_ = 0xffffffff;
            auVar67._0_8_ = 0xffffffffffffffff;
            auVar67._12_4_ = 0xffffffff;
            if (iVar19 != 0) {
              auVar68._8_4_ = uVar51;
              auVar68._12_4_ = uVar53;
              auVar67 = auVar68;
            }
            lVar34 = lVar34 + uVar24;
            auVar45._0_4_ = valid.field_0.i[0] & auVar67._0_4_;
            auVar45._4_4_ = valid.field_0.i[1] & auVar67._4_4_;
            auVar45._8_4_ = valid.field_0.i[2] & auVar67._8_4_;
            auVar45._12_4_ = valid.field_0.i[3] & auVar67._12_4_;
            uVar20 = movmskps(iVar19,auVar45);
            uVar29 = CONCAT44((int)((ulong)context >> 0x20),uVar20);
            pGVar30 = (Geometry *)0x0;
            if (uVar29 != 0) {
              for (; (uVar29 >> (long)pGVar30 & 1) == 0;
                  pGVar30 = (Geometry *)((long)&(pGVar30->super_RefCount)._vptr_RefCount + 1)) {
              }
            }
LAB_00261ef0:
            h.geomID.field_0.i[0] = *(uint *)(lVar34 + 0x90 + (long)pGVar30 * 4);
            pGVar22 = (pSVar9->geometries).items[h.geomID.field_0.i[0]].ptr;
            if ((pGVar22->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
              valid.field_0.v[(long)pGVar30] = 0.0;
            }
            else {
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar22->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                fVar89 = local_10e8[(long)pGVar30];
                fVar107 = local_10d8[(long)pGVar30];
                *(undefined4 *)(ray + k * 4 + 0x80) =
                     *(undefined4 *)(local_10c8 + (long)pGVar30 * 4);
                *(undefined4 *)(ray + k * 4 + 0xc0) =
                     *(undefined4 *)((long)&local_10b8 + (long)pGVar30 * 4);
                *(undefined4 *)(ray + k * 4 + 0xd0) =
                     *(undefined4 *)(local_10a8 + (long)pGVar30 * 4);
                *(float *)(ray + k * 4 + 0xe0) = local_1098[(long)pGVar30];
                *(float *)(ray + k * 4 + 0xf0) = fVar89;
                *(float *)(ray + k * 4 + 0x100) = fVar107;
                *(undefined4 *)(ray + k * 4 + 0x110) =
                     *(undefined4 *)(lVar34 + 0xa0 + (long)pGVar30 * 4);
                *(undefined4 *)(ray + k * 4 + 0x120) = h.geomID.field_0.i[0];
                *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                uVar38 = context->user->instPrimID[0];
                pSStack_1230 = (StackItemT<embree::NodeRefPtr<4>_> *)(ulong)uVar38;
                *(uint *)(ray + k * 4 + 0x140) = uVar38;
                goto LAB_00261d9a;
              }
              local_1088 = auVar86;
              h.u.field_0.v[0] = local_10e8[(long)pGVar30];
              h.v.field_0.v[0] = local_10d8[(long)pGVar30];
              uVar20 = *(undefined4 *)((long)&local_10b8 + (long)pGVar30 * 4);
              uVar21 = *(undefined4 *)(local_10a8 + (long)pGVar30 * 4);
              uVar6 = *(undefined4 *)(lVar34 + 0xa0 + (long)pGVar30 * 4);
              h.primID.field_0.i[1] = uVar6;
              h.primID.field_0.i[0] = uVar6;
              h.primID.field_0.i[2] = uVar6;
              h.primID.field_0.i[3] = uVar6;
              h.Ng.field_0._4_4_ = uVar20;
              h.Ng.field_0._0_4_ = uVar20;
              h.Ng.field_0._8_4_ = uVar20;
              h.Ng.field_0._12_4_ = uVar20;
              h.Ng.field_0._20_4_ = uVar21;
              h.Ng.field_0._16_4_ = uVar21;
              h.Ng.field_0._24_4_ = uVar21;
              h.Ng.field_0._28_4_ = uVar21;
              fVar89 = local_1098[(long)pGVar30];
              h.Ng.field_0._36_4_ = (int)fVar89;
              h.Ng.field_0._32_4_ = (int)fVar89;
              h.Ng.field_0._40_4_ = (int)fVar89;
              h.Ng.field_0._44_4_ = (int)fVar89;
              h.u.field_0.v[1] = h.u.field_0.v[0];
              h.u.field_0.v[2] = h.u.field_0.v[0];
              h.u.field_0.v[3] = h.u.field_0.v[0];
              h.v.field_0.v[1] = h.v.field_0.v[0];
              h.v.field_0.v[2] = h.v.field_0.v[0];
              h.v.field_0.v[3] = h.v.field_0.v[0];
              h.geomID.field_0.i[1] = h.geomID.field_0.i[0];
              h.geomID.field_0.i[2] = h.geomID.field_0.i[0];
              h.geomID.field_0.i[3] = h.geomID.field_0.i[0];
              h.instID[0].field_0.i[0] = context->user->instID[0];
              h.instID[0].field_0.i[1] = h.instID[0].field_0.i[0];
              h.instID[0].field_0.i[2] = h.instID[0].field_0.i[0];
              h.instID[0].field_0.i[3] = h.instID[0].field_0.i[0];
              h.instPrimID[0].field_0.i[0] = context->user->instPrimID[0];
              h.instPrimID[0].field_0.i[1] = h.instPrimID[0].field_0.i[0];
              h.instPrimID[0].field_0.i[2] = h.instPrimID[0].field_0.i[0];
              h.instPrimID[0].field_0.i[3] = h.instPrimID[0].field_0.i[0];
              uVar20 = *(undefined4 *)(ray + k * 4 + 0x80);
              *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_10c8 + (long)pGVar30 * 4);
              local_11b8 = *local_1180;
              uStack_11b0 = local_1180[1];
              args.valid = (int *)&local_11b8;
              args.geometryUserPtr = pGVar22->userPtr;
              args.context = context->user;
              args.hit = (RTCHitN *)&h;
              args.N = 4;
              local_11a8 = lVar23;
              local_11a0 = uVar28;
              local_1198 = uVar27;
              local_1190 = uVar26;
              local_1188 = pSVar32;
              args.ray = (RTCRayN *)ray;
              if (pGVar22->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                (*pGVar22->intersectionFilterN)(&args);
              }
              auVar16._8_8_ = uStack_11b0;
              auVar16._0_8_ = local_11b8;
              if (auVar16 == (undefined1  [16])0x0) {
                auVar56._8_4_ = 0xffffffff;
                auVar56._0_8_ = 0xffffffffffffffff;
                auVar56._12_4_ = 0xffffffff;
                auVar56 = auVar56 ^ _DAT_01febe20;
              }
              else {
                p_Var10 = context->args->filter;
                if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar22->field_8).field_0x2 & 0x40) != 0)))
                   ) {
                  (*p_Var10)(&args);
                }
                auVar17._8_8_ = uStack_11b0;
                auVar17._0_8_ = local_11b8;
                auVar46._0_4_ = -(uint)((int)local_11b8 == 0);
                auVar46._4_4_ = -(uint)((int)((ulong)local_11b8 >> 0x20) == 0);
                auVar46._8_4_ = -(uint)((int)uStack_11b0 == 0);
                auVar46._12_4_ = -(uint)((int)((ulong)uStack_11b0 >> 0x20) == 0);
                auVar56 = auVar46 ^ _DAT_01febe20;
                if (auVar17 != (undefined1  [16])0x0) {
                  auVar54 = blendvps(*(undefined1 (*) [16])args.hit,
                                     *(undefined1 (*) [16])(args.ray + 0xc0),auVar46);
                  *(undefined1 (*) [16])(args.ray + 0xc0) = auVar54;
                  auVar54 = blendvps(*(undefined1 (*) [16])(args.hit + 0x10),
                                     *(undefined1 (*) [16])(args.ray + 0xd0),auVar46);
                  *(undefined1 (*) [16])(args.ray + 0xd0) = auVar54;
                  auVar54 = blendvps(*(undefined1 (*) [16])(args.hit + 0x20),
                                     *(undefined1 (*) [16])(args.ray + 0xe0),auVar46);
                  *(undefined1 (*) [16])(args.ray + 0xe0) = auVar54;
                  auVar54 = blendvps(*(undefined1 (*) [16])(args.hit + 0x30),
                                     *(undefined1 (*) [16])(args.ray + 0xf0),auVar46);
                  *(undefined1 (*) [16])(args.ray + 0xf0) = auVar54;
                  auVar54 = blendvps(*(undefined1 (*) [16])(args.hit + 0x40),
                                     *(undefined1 (*) [16])(args.ray + 0x100),auVar46);
                  *(undefined1 (*) [16])(args.ray + 0x100) = auVar54;
                  auVar54 = blendvps(*(undefined1 (*) [16])(args.hit + 0x50),
                                     *(undefined1 (*) [16])(args.ray + 0x110),auVar46);
                  *(undefined1 (*) [16])(args.ray + 0x110) = auVar54;
                  auVar54 = blendvps(*(undefined1 (*) [16])(args.hit + 0x60),
                                     *(undefined1 (*) [16])(args.ray + 0x120),auVar46);
                  *(undefined1 (*) [16])(args.ray + 0x120) = auVar54;
                  auVar54 = blendvps(*(undefined1 (*) [16])(args.hit + 0x70),
                                     *(undefined1 (*) [16])(args.ray + 0x130),auVar46);
                  *(undefined1 (*) [16])(args.ray + 0x130) = auVar54;
                  auVar54 = blendvps(*(undefined1 (*) [16])(args.hit + 0x80),
                                     *(undefined1 (*) [16])(args.ray + 0x140),auVar46);
                  *(undefined1 (*) [16])(args.ray + 0x140) = auVar54;
                }
              }
              if ((_DAT_01fecb20 & auVar56) == (undefined1  [16])0x0) {
                *(undefined4 *)(ray + k * 4 + 0x80) = uVar20;
              }
              valid.field_0.v[(long)pGVar30] = 0.0;
              fVar89 = *(float *)(ray + k * 4 + 0x80);
              valid.field_0.i[1] = -(uint)(local_1088._4_4_ <= fVar89) & valid.field_0.i[1];
              valid.field_0.i[0] = -(uint)(local_1088._0_4_ <= fVar89) & valid.field_0.i[0];
              valid.field_0.i[2] = -(uint)(local_1088._8_4_ <= fVar89) & valid.field_0.i[2];
              valid.field_0.i[3] = -(uint)(local_1088._12_4_ <= fVar89) & valid.field_0.i[3];
              pGVar22 = pGVar30;
              lVar23 = local_11a8;
              uVar26 = local_1190;
              uVar27 = local_1198;
              uVar28 = local_11a0;
              pSVar32 = local_1188;
              auVar86 = local_1088;
            }
            uVar20 = (undefined4)((ulong)pGVar22 >> 0x20);
            iVar19 = movmskps((int)pGVar22,(undefined1  [16])valid.field_0);
            pSStack_1230 = (StackItemT<embree::NodeRefPtr<4>_> *)CONCAT44(uVar20,iVar19);
            if (iVar19 == 0) goto LAB_00261d9a;
            auVar65 = blendvps(_DAT_01feb9f0,auVar86,(undefined1  [16])valid.field_0);
            auVar79._4_4_ = auVar65._0_4_;
            auVar79._0_4_ = auVar65._4_4_;
            auVar79._8_4_ = auVar65._12_4_;
            auVar79._12_4_ = auVar65._8_4_;
            auVar54 = minps(auVar79,auVar65);
            auVar57._0_8_ = auVar54._8_8_;
            auVar57._8_4_ = auVar54._0_4_;
            auVar57._12_4_ = auVar54._4_4_;
            auVar54 = minps(auVar57,auVar54);
            auVar58._0_8_ =
                 CONCAT44(-(uint)(auVar54._4_4_ == auVar65._4_4_) & valid.field_0._4_4_,
                          -(uint)(auVar54._0_4_ == auVar65._0_4_) & valid.field_0._0_4_);
            auVar58._8_4_ = -(uint)(auVar54._8_4_ == auVar65._8_4_) & valid.field_0._8_4_;
            auVar58._12_4_ = -(uint)(auVar54._12_4_ == auVar65._12_4_) & valid.field_0._12_4_;
            iVar19 = movmskps(iVar19,auVar58);
            aVar47 = valid.field_0;
            if (iVar19 != 0) {
              aVar47.i[2] = auVar58._8_4_;
              aVar47._0_8_ = auVar58._0_8_;
              aVar47.i[3] = auVar58._12_4_;
            }
            uVar21 = movmskps(iVar19,(undefined1  [16])aVar47);
            uVar29 = CONCAT44(uVar20,uVar21);
            pGVar30 = (Geometry *)0x0;
            if (uVar29 != 0) {
              for (; (uVar29 >> (long)pGVar30 & 1) == 0;
                  pGVar30 = (Geometry *)((long)&(pGVar30->super_RefCount)._vptr_RefCount + 1)) {
              }
            }
            goto LAB_00261ef0;
          }
        }
LAB_00261d9a:
        lVar36 = lVar36 + 1;
      } while (lVar36 != lVar23);
    }
    iVar19 = *(int *)(ray + k * 4 + 0x80);
    fVar89 = local_1018;
    fVar107 = fStack_1014;
    fVar101 = fStack_1010;
    fVar103 = fStack_100c;
    fVar96 = local_1028;
    fVar113 = fStack_1024;
    fVar116 = fStack_1020;
    fVar119 = fStack_101c;
    fVar122 = local_1038;
    fVar125 = fStack_1034;
    fVar99 = fStack_1030;
    fVar100 = fStack_102c;
    fVar73 = local_1048;
    fVar76 = fStack_1044;
    fVar110 = fStack_1040;
    fVar112 = fStack_103c;
    fVar114 = local_1058;
    fVar117 = fStack_1054;
    fVar120 = fStack_1050;
    fVar123 = fStack_104c;
    fVar126 = local_1068;
    fVar127 = fStack_1064;
    fVar128 = fStack_1060;
    fVar129 = fStack_105c;
    iVar130 = local_1078;
    iVar132 = iStack_1074;
    iVar134 = iStack_1070;
    iVar136 = iStack_106c;
    iVar59 = iVar19;
    iVar60 = iVar19;
    iVar61 = iVar19;
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }